

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

void __thiscall
jsoncons::
index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>::
index_key_value<jsoncons::byte_string_arg_t_const&,jsoncons::byte_string_view_const&,jsoncons::semantic_tag&>
          (index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>_>
           *this,key_type *Name,int64_t Index,byte_string_arg_t *args,byte_string_view *args_1,
          semantic_tag *args_2)

{
  undefined1 uVar1;
  undefined8 in_RDX;
  wstring *in_RSI;
  wstring *in_RDI;
  undefined8 in_R8;
  undefined1 *in_R9;
  allocator<wchar_t> local_32 [2];
  undefined1 *local_30;
  undefined8 local_28;
  undefined8 local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  std::__cxx11::wstring::wstring(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = local_18;
  uVar1 = *local_30;
  std::allocator<wchar_t>::allocator();
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::
  basic_json<jsoncons::byte_string_view>
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
             (in_RDI + 0x28),local_28,uVar1,local_32,0);
  std::allocator<wchar_t>::~allocator(local_32);
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }